

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O2

void Omega_h::anon_unknown_41::promote_bools(LO size,any *lhs,any *rhs)

{
  bool bVar1;
  int iVar2;
  type_info *ptVar3;
  Write<signed_char> local_30;
  
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar3 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar3 = (*lhs->vtable->type)();
  }
  bVar1 = std::type_info::operator==(ptVar3,(type_info *)&bool::typeinfo);
  if (bVar1) {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*rhs->vtable->type)();
    }
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&Read<signed_char>::typeinfo);
    if (bVar1) {
      any_cast<Omega_h::Read<signed_char>>((Omega_h *)&local_30,rhs);
      if (((ulong)local_30.shared_alloc_.alloc & 1) == 0) {
        iVar2 = (int)(local_30.shared_alloc_.alloc)->size;
      }
      else {
        iVar2 = (int)((ulong)local_30.shared_alloc_.alloc >> 3);
      }
      if (iVar2 != size) {
        fail("assertion %s failed at %s +%d\n","any_cast<Bytes>(rhs).size() == size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
             ,0x15);
      }
      Write<signed_char>::~Write(&local_30);
      promote_bool(size,lhs);
    }
  }
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar3 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar3 = (*lhs->vtable->type)();
  }
  bVar1 = std::type_info::operator==(ptVar3,(type_info *)&Read<signed_char>::typeinfo);
  if (bVar1) {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*rhs->vtable->type)();
    }
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&bool::typeinfo);
    if (bVar1) {
      any_cast<Omega_h::Read<signed_char>>((Omega_h *)&local_30,lhs);
      if (((ulong)local_30.shared_alloc_.alloc & 1) == 0) {
        iVar2 = (int)(local_30.shared_alloc_.alloc)->size;
      }
      else {
        iVar2 = (int)((ulong)local_30.shared_alloc_.alloc >> 3);
      }
      if (iVar2 != size) {
        fail("assertion %s failed at %s +%d\n","any_cast<Bytes>(lhs).size() == size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
             ,0x19);
      }
      Write<signed_char>::~Write(&local_30);
      promote_bool(size,rhs);
    }
  }
  return;
}

Assistant:

void promote_bools(LO size, any& lhs, any& rhs) {
  if (lhs.type() == typeid(bool) && rhs.type() == typeid(Bytes)) {
    OMEGA_H_CHECK(any_cast<Bytes>(rhs).size() == size);
    promote_bool(size, lhs);
  }
  if (lhs.type() == typeid(Bytes) && rhs.type() == typeid(bool)) {
    OMEGA_H_CHECK(any_cast<Bytes>(lhs).size() == size);
    promote_bool(size, rhs);
  }
}